

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O2

int __thiscall brown::App::runGraphics(App *this)

{
  int iVar1;
  
  iVar1 = appInit(this);
  if (iVar1 == 0) {
    while (this->isBreak == false) {
      appEventHandle(this);
      iVar1 = beginDraw(this);
      if (iVar1 == 0) {
        Simulator::renderLoop(this->sim,&this->dd);
      }
      endDraw(this);
      SDL_Delay(0x1e);
    }
    appExit(this);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int App::runGraphics() {
    if (appInit() != 0) {return -1;}
    while (!isBreak) {
        appEventHandle();
        if (beginDraw() == 0) {
            sim.renderLoop(dd);
        }
        endDraw();
        SDL_Delay(30);
    }
    appExit();
    return 0;
}